

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QGlyphRun>::
appendIteratorRange<QHash<std::pair<QFontEngine*,int>,QGlyphRun>::const_iterator>
          (QCommonArrayOps<QGlyphRun> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::const_iterator>
          param_3)

{
  qsizetype *pqVar1;
  QGlyphRun *this_00;
  Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *pDVar2;
  ulong uVar3;
  
  uVar3 = b.i.bucket;
  pDVar2 = b.i.d;
  if (uVar3 != e.i.bucket || pDVar2 != e.i.d) {
    this_00 = (this->super_Type).super_QGenericArrayOps<QGlyphRun>.
              super_QArrayDataPointer<QGlyphRun>.ptr +
              (this->super_Type).super_QGenericArrayOps<QGlyphRun>.
              super_QArrayDataPointer<QGlyphRun>.size;
    do {
      QGlyphRun::QGlyphRun
                (this_00,(QGlyphRun *)
                         (pDVar2->spans[uVar3 >> 7].entries
                          [pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data +
                         0x10));
      pqVar1 = &(this->super_Type).super_QGenericArrayOps<QGlyphRun>.
                super_QArrayDataPointer<QGlyphRun>.size;
      *pqVar1 = *pqVar1 + 1;
      this_00 = this_00 + 1;
      do {
        if (pDVar2->numBuckets - 1 == uVar3) {
          uVar3 = 0;
          pDVar2 = (Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *)0x0;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    } while (uVar3 != e.i.bucket || pDVar2 != e.i.d);
  }
  return;
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }